

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::addConstructor
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *node,TType *type)

{
  TIntermNode *node_00;
  char cVar1;
  int iVar2;
  TOperator op;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  TIntermTyped *pTVar6;
  TTypeList *pTVar7;
  TSourceLoc *loc_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TType *pTVar9;
  undefined8 *puVar10;
  TIntermediate *this_00;
  pointer local_188;
  TType elementType;
  TType dereferenced;
  undefined4 extraout_var_00;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[6])(node);
  pTVar6 = (TIntermTyped *)CONCAT44(extraout_var,iVar2);
  op = TIntermediate::mapTypeToConstructorOp
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (op == EOpConstructTextureSampler) {
    pTVar6 = TIntermediate::setAggregateOperator
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TIntermNode *)pTVar6,EOpConstructTextureSampler,type,loc);
    return pTVar6;
  }
  if (op == EOpConstructStruct) {
    pTVar7 = TType::getStruct(type);
    local_188 = (pTVar7->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_188 = (pointer)0x0;
  }
  TType::TType(&elementType,EbtVoid,EvqTemporary,1,0,0,false);
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  pTVar9 = type;
  if ((char)iVar2 != '\0') {
    TType::TType(&dereferenced,type,0,false);
    pTVar9 = &dereferenced;
  }
  TType::shallowCopy(&elementType,pTVar9);
  if ((pTVar6 != (TIntermTyped *)0x0) &&
     (*(int *)&pTVar6[1].super_TIntermNode._vptr_TIntermNode == 0)) {
    iVar3 = (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[0x32])();
    iVar2 = 1;
    for (puVar10 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar3) + 8);
        puVar10 != *(undefined8 **)(CONCAT44(extraout_var_02,iVar3) + 0x10); puVar10 = puVar10 + 1)
    {
      iVar4 = (*type->_vptr_TType[0x1d])(type);
      node_00 = (TIntermNode *)*puVar10;
      if ((char)iVar4 == '\0') {
        if (op == EOpConstructStruct) {
          pTVar9 = local_188->type;
          iVar4 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
          pTVar8 = constructAggregate(this,node_00,pTVar9,iVar2,
                                      (TSourceLoc *)CONCAT44(extraout_var_04,iVar4));
        }
        else {
          iVar4 = (*node_00->_vptr_TIntermNode[3])(node_00);
          iVar5 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
          pTVar8 = constructBuiltIn(this,type,op,(TIntermTyped *)CONCAT44(extraout_var_05,iVar4),
                                    (TSourceLoc *)CONCAT44(extraout_var_06,iVar5),true);
        }
      }
      else {
        iVar4 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        pTVar8 = constructAggregate(this,node_00,&elementType,iVar2,
                                    (TSourceLoc *)CONCAT44(extraout_var_03,iVar4));
      }
      if (pTVar8 == (TIntermTyped *)0x0) {
        return (TIntermTyped *)0x0;
      }
      *puVar10 = pTVar8;
      iVar2 = iVar2 + 1;
      local_188 = local_188 + 1;
    }
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    goto LAB_00312d5f;
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if (((char)iVar2 == '\0') ||
     (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])(node), (char)iVar2 == '\0')) {
    iVar2 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar2 == '\0') {
      if (op != EOpConstructStruct) {
        iVar2 = (*type->_vptr_TType[0x1c])(type);
        if ((char)iVar2 != '\0') {
          iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
          cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 200))
                            ((long *)CONCAT44(extraout_var_07,iVar2));
          if (cVar1 != '\0') {
            node = TIntermediate::addShapeConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,type
                              ,node);
          }
        }
        iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        pTVar6 = constructBuiltIn(this,type,op,node,(TSourceLoc *)CONCAT44(extraout_var_08,iVar2),
                                  false);
        goto LAB_00312d0c;
      }
      pTVar9 = local_188->type;
      iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_01,iVar2);
    }
    else {
      iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_00,iVar2);
      pTVar9 = &elementType;
    }
    pTVar6 = constructAggregate(this,&node->super_TIntermNode,pTVar9,1,loc_00);
  }
  else {
    pTVar6 = convertArray(this,node,type);
  }
LAB_00312d0c:
  if (pTVar6 == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((op != EOpConstructStruct) && ((char)iVar2 == '\0')) {
    return pTVar6;
  }
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  op = EOpConstructStruct;
LAB_00312d5f:
  pTVar6 = TIntermediate::setAggregateOperator(this_00,&pTVar6->super_TIntermNode,op,type,loc);
  return pTVar6;
}

Assistant:

TIntermTyped* HlslParseContext::addConstructor(const TSourceLoc& loc, TIntermTyped* node, const TType& type)
{
    TIntermAggregate* aggrNode = node->getAsAggregate();
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    if (op == EOpConstructTextureSampler)
        return intermediate.setAggregateOperator(aggrNode, op, type, loc);

    TTypeList::const_iterator memberTypes;
    if (op == EOpConstructStruct)
        memberTypes = type.getStruct()->begin();

    TType elementType;
    if (type.isArray()) {
        TType dereferenced(type, 0);
        elementType.shallowCopy(dereferenced);
    } else
        elementType.shallowCopy(type);

    bool singleArg;
    if (aggrNode != nullptr) {
        if (aggrNode->getOp() != EOpNull)
            singleArg = true;
        else
            singleArg = false;
    } else
        singleArg = true;

    TIntermTyped *newNode;
    if (singleArg) {
        // Handle array -> array conversion
        // Constructing an array of one type from an array of another type is allowed,
        // assuming there are enough components available (semantic-checked earlier).
        if (type.isArray() && node->isArray())
            newNode = convertArray(node, type);

        // If structure constructor or array constructor is being called
        // for only one parameter inside the aggregate, we need to call constructAggregate function once.
        else if (type.isArray())
            newNode = constructAggregate(node, elementType, 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(node, *(*memberTypes).type, 1, node->getLoc());
        else {
            // shape conversion for matrix constructor from scalar.  HLSL semantics are: scalar
            // is replicated into every element of the matrix (not just the diagnonal), so
            // that is handled specially here.
            if (type.isMatrix() && node->getType().isScalarOrVec1())
                node = intermediate.addShapeConversion(type, node);

            newNode = constructBuiltIn(type, op, node, node->getLoc(), false);
        }

        if (newNode && (type.isArray() || op == EOpConstructStruct))
            newNode = intermediate.setAggregateOperator(newNode, EOpConstructStruct, type, loc);

        return newNode;
    }

    //
    // Handle list of arguments.
    //
    TIntermSequence& sequenceVector = aggrNode->getSequence();    // Stores the information about the parameter to the constructor
    // if the structure constructor contains more than one parameter, then construct
    // each parameter

    int paramCount = 0;  // keeps a track of the constructor parameter number being checked

    // for each parameter to the constructor call, check to see if the right type is passed or convert them
    // to the right type if possible (and allowed).
    // for structure constructors, just check if the right type is passed, no conversion is allowed.

    for (TIntermSequence::iterator p = sequenceVector.begin();
        p != sequenceVector.end(); p++, paramCount++) {
        if (type.isArray())
            newNode = constructAggregate(*p, elementType, paramCount + 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(*p, *(memberTypes[paramCount]).type, paramCount + 1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, (*p)->getAsTyped(), node->getLoc(), true);

        if (newNode)
            *p = newNode;
        else
            return nullptr;
    }

    TIntermTyped* constructor = intermediate.setAggregateOperator(aggrNode, op, type, loc);

    return constructor;
}